

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Message_Test::TestBody
          (LazilyBuildDependenciesTest_Message_Test *this)

{
  bool bVar1;
  char *pcVar2;
  FileDescriptor *this_00;
  Descriptor *pDVar3;
  char *in_R9;
  string local_418;
  AssertHelper local_3f8;
  Message local_3f0;
  string_view local_3e8;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3a0;
  Message local_398;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_358;
  Message local_350;
  string_view local_348;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__6;
  Message local_318;
  string_view local_310;
  FieldDescriptor *local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_2;
  Message local_2e0;
  string_view local_2d8;
  FieldDescriptor *local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  Message local_2a8;
  FieldDescriptor *local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__5;
  FieldDescriptor *local_230;
  FieldDescriptor *field;
  Descriptor *local_218;
  Descriptor *desc;
  AssertHelper local_1f0;
  Message local_1e8;
  string_view local_1e0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_198;
  Message local_190;
  string_view local_188;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  FileDescriptor *file;
  AssertHelper local_e0;
  Message local_d8;
  string_view local_d0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80 [3];
  string_view local_68;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  string_view local_30;
  string_view local_20;
  LazilyBuildDependenciesTest_Message_Test *local_10;
  LazilyBuildDependenciesTest_Message_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n    name: \'foo.proto\'\n    package: \'proto2_unittest\'\n    dependency: \'bar.proto\'\n    message_type {\n      name: \'Foo\'\n      field {\n        name: \'bar\'\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_MESSAGE\n        type_name: \'.proto2_unittest.Bar\'\n      }\n    }"
            );
  LazilyBuildDependenciesTest::ParseProtoAndAddToDb
            (&this->super_LazilyBuildDependenciesTest,local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"bar");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,"Bar");
  LazilyBuildDependenciesTest::AddSimpleMessageProtoFileToDb
            (&this->super_LazilyBuildDependenciesTest,local_30,stack0xffffffffffffffc0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"foo.proto");
  local_51 = DescriptorPool::InternalIsFileLoaded
                       (&(this->super_LazilyBuildDependenciesTest).pool_,local_68);
  local_51 = !local_51;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"foo.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3994,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"bar.proto");
  local_b9 = DescriptorPool::InternalIsFileLoaded
                       (&(this->super_LazilyBuildDependenciesTest).pool_,local_d0);
  local_b9 = !local_b9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&file,(internal *)local_b8,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3995,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&file);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2.message_,"foo.proto");
  this_00 = DescriptorPool::FindFileByName
                      (&(this->super_LazilyBuildDependenciesTest).pool_,stack0xfffffffffffffee8);
  local_129 = this_00 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,(AssertionResult *)0x1d2399f,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"foo.proto");
  local_171 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_188);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_170,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"foo.proto\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"bar.proto");
  local_1c9 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_1e0);
  local_1c9 = !local_1c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&desc,(internal *)local_1c8,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&desc);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&field,"Foo");
  pDVar3 = FileDescriptor::FindMessageTypeByName(this_00,_field);
  local_218 = pDVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__5.message_,"bar");
  local_230 = Descriptor::FindFieldByName(pDVar3,stack0xfffffffffffffdc0);
  local_251 = local_230 != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_250,(AssertionResult *)0x1e0795f,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_2a0 = Descriptor::FindFieldByNumber(local_218,1);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_298,"field","desc->FindFieldByNumber(1)",&local_230,&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  pDVar3 = local_218;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"bar");
  local_2c8 = Descriptor::FindFieldByLowercaseName(pDVar3,local_2d8);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_2c0,"field","desc->FindFieldByLowercaseName(\"bar\")",&local_230,
             &local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  pDVar3 = local_218;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_310,"bar");
  local_300 = Descriptor::FindFieldByCamelcaseName(pDVar3,local_310);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_2f8,"field","desc->FindFieldByCamelcaseName(\"bar\")",&local_230,
             &local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,"bar.proto");
  local_331 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_348);
  local_331 = !local_331;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_330,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  pDVar3 = FieldDescriptor::message_type(local_230);
  local_389 = pDVar3 != (Descriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_388,&local_389,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_388,
               (AssertionResult *)"field->message_type() != nullptr","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39ab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e8,"bar.proto");
  local_3d1 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_3e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_418,(internal *)local_3d0,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39ac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Message) {
  ParseProtoAndAddToDb(R"pb(
    name: 'foo.proto'
    package: 'proto2_unittest'
    dependency: 'bar.proto'
    message_type {
      name: 'Foo'
      field {
        name: 'bar'
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_MESSAGE
        type_name: '.proto2_unittest.Bar'
      }
    })pb");
  AddSimpleMessageProtoFileToDb("bar", "Bar");

  // Verify neither has been built yet.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify only foo gets built when asking for foo.proto
  EXPECT_TRUE(file != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Verify calling FindFieldBy* works when the type of the field was
  // not built at cross link time. Verify this doesn't build the file
  // the field's type is defined in, as well.
  const Descriptor* desc = file->FindMessageTypeByName("Foo");
  const FieldDescriptor* field = desc->FindFieldByName("bar");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field, desc->FindFieldByNumber(1));
  EXPECT_EQ(field, desc->FindFieldByLowercaseName("bar"));
  EXPECT_EQ(field, desc->FindFieldByCamelcaseName("bar"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Finally, verify that if we call message_type() on the field, we will
  // build the file where the message is defined, and get a valid descriptor
  EXPECT_TRUE(field->message_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("bar.proto"));
}